

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void ecs_hash(void *data,ecs_size_t length,uint64_t *result)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  uVar1 = ecs_to_size_t((long)length);
  uVar4 = (int)uVar1 + 0xdeadbeef;
  uVar2 = uVar4;
  uVar6 = uVar4;
  if (((ulong)data & 3) == 0) {
    for (; 0xc < uVar1; uVar1 = uVar1 - 0xc) {
      uVar2 = uVar2 + *(int *)((long)data + 8);
      uVar4 = (uVar2 * 0x10 | uVar2 >> 0x1c) ^ (uVar4 + *data) - uVar2;
      iVar3 = uVar2 + uVar6 + *(int *)((long)data + 4);
      uVar2 = (uVar4 << 6 | uVar4 >> 0x1a) ^ (uVar6 + *(int *)((long)data + 4)) - uVar4;
      iVar5 = uVar4 + iVar3;
      uVar6 = (uVar2 << 8 | uVar2 >> 0x18) ^ iVar3 - uVar2;
      iVar3 = uVar2 + iVar5;
      uVar4 = (uVar6 << 0x10 | uVar6 >> 0x10) ^ iVar5 - uVar6;
      iVar5 = uVar6 + iVar3;
      uVar6 = (uVar4 << 0x13 | uVar4 >> 0xd) ^ iVar3 - uVar4;
      uVar4 = uVar4 + iVar5;
      data = (void *)((long)data + 0xc);
      uVar2 = (uVar6 << 4 | uVar6 >> 0x1c) ^ iVar5 - uVar6;
      uVar6 = uVar6 + uVar4;
    }
    (*(code *)(&DAT_0013d648 + *(int *)(&DAT_0013d648 + uVar1 * 4)))
              (&DAT_0013d648,uVar4,uVar6,uVar2);
    return;
  }
  if (((ulong)data & 1) != 0) {
    for (; 0xc < uVar1; uVar1 = uVar1 - 0xc) {
      iVar3 = (uint)*(byte *)((long)data + 7) * 0x1000000 +
              (uint)*(byte *)((long)data + 6) * 0x10000 +
              (uint)*(byte *)((long)data + 5) * 0x100 + *(byte *)((long)data + 4) + uVar6;
      uVar2 = (uint)*(byte *)((long)data + 0xb) * 0x1000000 +
              (uint)*(byte *)((long)data + 10) * 0x10000 +
              (uint)*(byte *)((long)data + 9) * 0x100 + *(byte *)((long)data + 8) + uVar2;
      uVar4 = (uVar2 * 0x10 | uVar2 >> 0x1c) ^
              ((uint)*(byte *)((long)data + 3) * 0x1000000 +
               (uint)*(byte *)((long)data + 2) * 0x10000 +
              (uint)*(byte *)((long)data + 1) * 0x100 + *data + uVar4) - uVar2;
      iVar5 = uVar2 + iVar3;
      uVar2 = (uVar4 << 6 | uVar4 >> 0x1a) ^ iVar3 - uVar4;
      iVar3 = uVar4 + iVar5;
      uVar6 = (uVar2 << 8 | uVar2 >> 0x18) ^ iVar5 - uVar2;
      iVar5 = uVar2 + iVar3;
      uVar4 = (uVar6 << 0x10 | uVar6 >> 0x10) ^ iVar3 - uVar6;
      iVar3 = uVar6 + iVar5;
      uVar6 = (uVar4 << 0x13 | uVar4 >> 0xd) ^ iVar5 - uVar4;
      uVar4 = uVar4 + iVar3;
      data = (void *)((long)data + 0xc);
      uVar2 = (uVar6 << 4 | uVar6 >> 0x1c) ^ iVar3 - uVar6;
      uVar6 = uVar6 + uVar4;
    }
    (*(code *)(&DAT_0013d5e0 + *(int *)(&DAT_0013d5e0 + uVar1 * 4)))
              (&DAT_0013d5e0,uVar4,uVar6,uVar2);
    return;
  }
  for (; 0xc < uVar1; uVar1 = uVar1 - 0xc) {
    uVar2 = uVar2 + *(int *)((long)data + 8);
    uVar4 = (uVar2 * 0x10 | uVar2 >> 0x1c) ^ (uVar4 + *data) - uVar2;
    iVar3 = uVar2 + uVar6 + *(int *)((long)data + 4);
    uVar2 = (uVar4 << 6 | uVar4 >> 0x1a) ^ (uVar6 + *(int *)((long)data + 4)) - uVar4;
    iVar5 = uVar4 + iVar3;
    uVar6 = (uVar2 << 8 | uVar2 >> 0x18) ^ iVar3 - uVar2;
    iVar3 = uVar2 + iVar5;
    uVar4 = (uVar6 << 0x10 | uVar6 >> 0x10) ^ iVar5 - uVar6;
    iVar5 = uVar6 + iVar3;
    uVar6 = (uVar4 << 0x13 | uVar4 >> 0xd) ^ iVar3 - uVar4;
    uVar4 = uVar4 + iVar5;
    data = (void *)((long)data + 0xc);
    uVar2 = (uVar6 << 4 | uVar6 >> 0x1c) ^ iVar5 - uVar6;
    uVar6 = uVar6 + uVar4;
  }
  (*(code *)(&DAT_0013d614 + *(int *)(&DAT_0013d614 + uVar1 * 4)))(&DAT_0013d614,uVar4,uVar6,uVar2);
  return;
}

Assistant:

void ecs_hash(
    const void *data,
    ecs_size_t length,
    uint64_t *result)
{
    uint32_t h_1 = 0;
    uint32_t h_2 = 0;

    hashlittle2(
        data,
        ecs_to_size_t(length),
        &h_1,
        &h_2);

    *result = h_1 | ((uint64_t)h_2 << 32);
}